

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsInput anon_unknown.dwarf_7c49a::findOrCreateInput(HelicsFederate fed,Input *input)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar2;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  InputObject *pIVar6;
  undefined8 *puVar7;
  _Head_base<0UL,_helics::InputObject_*,_false> _Var8;
  pointer *__ptr;
  ulong uVar9;
  const_iterator __position;
  FedObject *fedObj;
  __uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_> local_38;
  _Head_base<0UL,_helics::InputObject_*,_false> local_30;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  iVar1 = (input->super_Interface).handle.hid;
  puVar7 = *(undefined8 **)((long)fed + 0x50);
  uVar9 = (long)*(undefined8 **)((long)fed + 0x58) - (long)puVar7 >> 3;
  while (uVar3 = uVar9, 0 < (long)uVar3) {
    uVar9 = uVar3 >> 1;
    if (*(int *)(*(long *)(puVar7[uVar9] + 0x18) + 0x10) <= iVar1) {
      puVar7 = puVar7 + uVar9 + 1;
      uVar9 = ~uVar9 + uVar3;
    }
  }
  if ((puVar7 == *(undefined8 **)((long)fed + 0x58)) ||
     (_Var8._M_head_impl = (InputObject *)*puVar7,
     ((_Var8._M_head_impl)->inputPtr->super_Interface).handle.hid != iVar1)) {
    pIVar6 = (InputObject *)operator_new(0x20);
    *(undefined8 *)pIVar6 = 0;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pIVar6->inputPtr = input;
    local_30._M_head_impl = pIVar6;
    getValueFedSharedPtr(&local_28,(HelicsError *)fed);
    p_Var5 = p_Stack_20;
    peVar4 = local_28;
    local_28 = (element_type *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar4;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
       p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
    _Var8._M_head_impl = local_30._M_head_impl;
    local_38._M_t.
    super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
    super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
         (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
         (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
         local_30._M_head_impl;
    local_30._M_head_impl = (InputObject *)0x0;
    (_Var8._M_head_impl)->valid = 0x3456e052;
    __position._M_current =
         *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
          ((long)fed + 0x50);
    puVar2 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
              ((long)fed + 0x58);
    if ((__position._M_current == puVar2) ||
       (iVar1 = ((_Var8._M_head_impl)->inputPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>._M_t.
         super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
         super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
      ::emplace_back<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>
                ((vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
                  *)((long)fed + 0x50),
                 (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_38);
    }
    else {
      uVar9 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar9, 0 < (long)uVar3) {
        uVar9 = uVar3 >> 1;
        if (((__position._M_current[uVar9]._M_t.
              super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>.
              _M_t.
              super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
              .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar9 + 1;
          uVar9 = ~uVar9 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
                        *)((long)fed + 0x50),__position,(value_type *)&local_38);
    }
    if (local_38._M_t.
        super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
        super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_38,
                 (InputObject *)
                 local_38._M_t.
                 super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
                 .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl);
    }
    local_38._M_t.
    super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
    super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
         (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
         (_Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>)0x0;
    if (local_30._M_head_impl != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_30,local_30._M_head_impl);
    }
  }
  return _Var8._M_head_impl;
}

Assistant:

HelicsInput findOrCreateInput(HelicsFederate fed, helics::Input& input)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    const auto handle = input.getHandle();
    auto ind = std::upper_bound(fedObj->inputs.begin(), fedObj->inputs.end(), handle, inputSearch);
    if (ind != fedObj->inputs.end() && (*ind)->inputPtr->getHandle() == handle) {
        HelicsInput hinp = ind->get();
        return hinp;
    }
    auto inp = std::make_unique<helics::InputObject>();
    inp->inputPtr = &input;
    inp->fedptr = getValueFedSharedPtr(fed, nullptr);
    return addInput(fed, std::move(inp));
}